

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::IsVisibleToPlayer(AActor *this)

{
  DWORD DVar1;
  player_t *ppVar2;
  PClassPlayerPawn *ti;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AActor *pAVar7;
  MetaClass *pMVar8;
  PClassPlayerPawn **ppPVar9;
  MetaClass *this_00;
  PClassPlayerPawn *cls;
  uint i;
  bool visible;
  player_t *pPlayer;
  AActor *this_local;
  
  bVar3 = TObjPtr<AActor>::operator==
                    ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0),(AActor *)0x0)
  ;
  if (bVar3) {
    this_local._7_1_ = true;
  }
  else if (((this->VisibleToTeam == 0) ||
           (bVar3 = FBoolCVar::operator_cast_to_bool(&teamplay), !bVar3)) ||
          (DVar1 = this->VisibleToTeam,
          iVar5 = userinfo_t::GetTeam((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8)),
          DVar1 - 1 == iVar5)) {
    pAVar7 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    ppVar2 = pAVar7->player;
    if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo != (APlayerPawn *)0x0)) {
      pMVar8 = GetClass(this);
      uVar6 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::Size(&pMVar8->VisibleToPlayerClass);
      if (uVar6 != 0) {
        bVar3 = false;
        cls._0_4_ = 0;
        while( true ) {
          pMVar8 = GetClass(this);
          uVar6 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::Size
                            (&pMVar8->VisibleToPlayerClass);
          if (uVar6 <= (uint)cls) break;
          pMVar8 = GetClass(this);
          ppPVar9 = TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator[]
                              (&pMVar8->VisibleToPlayerClass,(ulong)(uint)cls);
          ti = *ppPVar9;
          if (ti != (PClassPlayerPawn *)0x0) {
            this_00 = APlayerPawn::GetClass(ppVar2->mo);
            bVar4 = PClass::IsDescendantOf((PClass *)this_00,(PClass *)ti);
            if (bVar4) {
              bVar3 = true;
              break;
            }
          }
          cls._0_4_ = (uint)cls + 1;
        }
        if (!bVar3) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::IsVisibleToPlayer() const
{
	// [BB] Safety check. This should never be NULL. Nevertheless, we return true to leave the default ZDoom behavior unaltered.
	if ( players[consoleplayer].camera == NULL )
		return true;
 
	if (VisibleToTeam != 0 && teamplay &&
		(signed)(VisibleToTeam-1) != players[consoleplayer].userinfo.GetTeam() )
		return false;

	const player_t* pPlayer = players[consoleplayer].camera->player;

	if (pPlayer && pPlayer->mo && GetClass()->VisibleToPlayerClass.Size() > 0)
	{
		bool visible = false;
		for(unsigned int i = 0;i < GetClass()->VisibleToPlayerClass.Size();++i)
		{
			PClassPlayerPawn *cls = GetClass()->VisibleToPlayerClass[i];
			if (cls && pPlayer->mo->GetClass()->IsDescendantOf(cls))
			{
				visible = true;
				break;
			}
		}
		if (!visible)
			return false;
	}

	// [BB] Passed all checks.
	return true;
}